

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O1

bool __thiscall Core::dataCheck(Core *this)

{
  bool bVar1;
  Core *this_00;
  _Alloc_hider local_30;
  undefined8 local_20;
  
  Parsing::File::getContent_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffd0,&this->_f);
  bVar1 = Parsing::Parser::checkHeaders
                    (&this->_p,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffffd0);
  if (!bVar1) {
    this_00 = (Core *)&stack0xffffffffffffffd0;
    local_30._M_p = (pointer)&stack0xffffffffffffffe0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)this_00,"Your UWU(s) aren\'t good!","");
    error(this_00,(string *)&stack0xffffffffffffffd0,false);
    if ((pointer)local_30._M_p != (pointer)&stack0xffffffffffffffe0) {
      operator_delete(local_30._M_p,(ulong)(local_20 + 1));
    }
  }
  return bVar1;
}

Assistant:

bool Core::dataCheck()
{
    if (!_p.checkHeaders(_f.getContent()))
        return error("Your UWU(s) aren't good!");
    return true;
}